

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

int set_cache_A_record(cache *Cache,char *label,void *data)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&Cache->lock);
  iVar1 = _set_cache_A_record(Cache,label,data);
  pthread_mutex_unlock((pthread_mutex_t *)&Cache->lock);
  return iVar1;
}

Assistant:

int _set_cache_A_record(cache*Cache,const char *label, void*data) {
  if(Cache->is_init==false){
    log_error("cache not init");
    return -1;
  }
  struct record* record = push_front(Cache,label);//预留空间
  if(record){
    #ifdef LOG_INCLUDED
    log_debug("set cache ;label= %s",((struct record_data*)data)->label);
    #endif 
    if(record->size>0){
      #ifdef LOG_INCLUDED
      log_debug("length>0");
      #endif
      Cache->realse(record);
    }
    return Cache->add(record,data);
  }else{
    return 0;
  }
}